

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_compression_utils.h
# Opt level: O0

void __thiscall
draco::OctahedronToolBox::CanonicalizeIntegerVector<int>(OctahedronToolBox *this,int *vec)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int64_t abs_sum;
  int *vec_local;
  OctahedronToolBox *this_local;
  
  iVar1 = *vec;
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  iVar3 = vec[1];
  if (iVar3 < 1) {
    iVar3 = -iVar3;
  }
  iVar4 = vec[2];
  if (iVar4 < 1) {
    iVar4 = -iVar4;
  }
  lVar2 = (long)iVar1 + (long)iVar3 + (long)iVar4;
  if (lVar2 == 0) {
    *vec = this->center_value_;
  }
  else {
    *vec = (int)(((long)*vec * (long)this->center_value_) / lVar2);
    vec[1] = (int)(((long)vec[1] * (long)this->center_value_) / lVar2);
    if (vec[2] < 0) {
      iVar1 = *vec;
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
      iVar3 = vec[1];
      if (iVar3 < 1) {
        iVar3 = -iVar3;
      }
      vec[2] = -((this->center_value_ - iVar1) - iVar3);
    }
    else {
      iVar1 = *vec;
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
      iVar3 = vec[1];
      if (iVar3 < 1) {
        iVar3 = -iVar3;
      }
      vec[2] = (this->center_value_ - iVar1) - iVar3;
    }
  }
  return;
}

Assistant:

void CanonicalizeIntegerVector(T *vec) const {
    static_assert(std::is_integral<T>::value, "T must be an integral type.");
    static_assert(std::is_signed<T>::value, "T must be a signed type.");
    const int64_t abs_sum = static_cast<int64_t>(std::abs(vec[0])) +
                            static_cast<int64_t>(std::abs(vec[1])) +
                            static_cast<int64_t>(std::abs(vec[2]));

    if (abs_sum == 0) {
      vec[0] = center_value_;  // vec[1] == v[2] == 0
    } else {
      vec[0] =
          (static_cast<int64_t>(vec[0]) * static_cast<int64_t>(center_value_)) /
          abs_sum;
      vec[1] =
          (static_cast<int64_t>(vec[1]) * static_cast<int64_t>(center_value_)) /
          abs_sum;
      if (vec[2] >= 0) {
        vec[2] = center_value_ - std::abs(vec[0]) - std::abs(vec[1]);
      } else {
        vec[2] = -(center_value_ - std::abs(vec[0]) - std::abs(vec[1]));
      }
    }
  }